

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O3

void __thiscall gvr::MultiTexturedMesh::loadPLY(MultiTexturedMesh *this,PLYReader *ply)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  size_t *psVar4;
  char *__s;
  char *pcVar5;
  pointer pbVar6;
  pointer pbVar7;
  bool bVar8;
  ply_type pVar9;
  ply_type pVar10;
  ply_type pVar11;
  long lVar12;
  long lVar13;
  PLYReader *pPVar14;
  MultiTexturedMesh *this_01;
  ulong uVar15;
  bool bVar16;
  FloatArrayReceiver vx;
  FloatArrayReceiver ss;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  TriangleReceiver tr;
  MultiTextureIndexReceiver ti;
  MultiTextureCoordReceiver tc;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  string local_3f8;
  string local_3d8;
  PLYReader *local_3b8;
  FloatArrayReceiver local_3b0;
  MultiTexturedMesh *local_390;
  FloatArrayReceiver local_388;
  FloatArrayReceiver local_368;
  FloatArrayReceiver local_348;
  FloatArrayReceiver local_328;
  FloatArrayReceiver local_308;
  FloatArrayReceiver local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  FloatArrayReceiver local_2a8;
  FloatArrayReceiver local_288;
  long local_268;
  PLYReceiver local_260;
  MultiTexturedMesh *local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  string local_230;
  PLYReceiver local_210;
  MultiTexturedMesh *local_208;
  PLYReceiver local_200;
  MultiTexturedMesh *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  FloatArrayReceiver local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_3b0.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"vertex","");
  local_3b8 = ply;
  local_268 = PLYReader::instancesOfElement(ply,(string *)&local_3b0);
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_3b0.size) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  pPVar14 = local_3b8;
  Model::setOriginFromPLY((Model *)this,local_3b8);
  __s = (pPVar14->filename)._M_dataplus._M_p;
  this_00 = &this->basepath;
  pcVar5 = (char *)(this->basepath)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar5,(ulong)__s);
  lVar12 = std::__cxx11::string::find_last_of((char *)this_00,0x127b5c,0xffffffffffffffff);
  if (lVar12 == -1) {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->basepath)._M_string_length,0x127467);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_3b0,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_3b0);
    if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_3b0.size) {
      operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::getComments(local_3b8,&local_2c8);
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[0xb])(this,0);
  local_390 = this;
  if (local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar15 = 0;
    do {
      lVar13 = std::__cxx11::string::find
                         ((char *)((long)&((local_2c8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar12),0x127b44,0);
      if ((lVar13 == 0) ||
         (lVar13 = std::__cxx11::string::find
                             ((char *)((long)&((local_2c8.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar12),0x127b50,0), lVar13 == 0))
      {
        std::__cxx11::string::substr
                  ((ulong)&local_3b0,
                   (long)&((local_2c8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12);
        gutil::trim((string *)&local_3b0);
        (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[0xb])
                  (this,(ulong)((int)((ulong)((long)(this->name).
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->name).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                               1));
        pbVar6 = (this->name).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar7 = (this->name).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_250[0] = local_240;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_250,local_3b0.super_PLYReceiver._vptr_PLYReceiver,
                   (long)local_3b0.array + (long)local_3b0.super_PLYReceiver._vptr_PLYReceiver);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((this->name).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   (((long)pbVar7 - (long)pbVar6) * 0x8000000 + -0x100000000 >> 0x20)));
        if (local_250[0] != local_240) {
          operator_delete(local_250[0]);
        }
        if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_3b0.size) {
          operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
        }
      }
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar15 < (ulong)((long)local_2c8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2c8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_3b0.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"vertex","");
  local_288.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_288.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"scan_size","");
  pPVar14 = local_3b8;
  pVar9 = PLYReader::getTypeOfProperty(local_3b8,(string *)&local_3b0,(string *)&local_288);
  uVar15 = 1;
  if (pVar9 == ply_none) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"vertex","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"scan_error","");
    pVar10 = PLYReader::getTypeOfProperty(pPVar14,&local_b0,&local_d0);
    if (pVar10 != ply_none) goto LAB_00122d5b;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"vertex","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"scan_conf","");
    pPVar14 = local_3b8;
    pVar10 = PLYReader::getTypeOfProperty(local_3b8,&local_1d0,&local_f0);
    uVar15 = (ulong)(pVar10 != ply_none);
    bVar16 = true;
  }
  else {
LAB_00122d5b:
    bVar16 = false;
  }
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_2a8.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"vertex","");
  psVar3 = &local_388.size;
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"sx","");
  pVar10 = PLYReader::getTypeOfProperty(pPVar14,(string *)&local_2a8,(string *)&local_388);
  if (pVar10 != ply_none) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"vertex","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"sy","");
    pVar11 = PLYReader::getTypeOfProperty(pPVar14,&local_110,&local_130);
    if (pVar11 != ply_none) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"vertex","");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"sz","");
      PLYReader::getTypeOfProperty(local_3b8,&local_1f0,&local_150);
      bVar8 = true;
      goto LAB_00122ea8;
    }
  }
  bVar8 = false;
LAB_00122ea8:
  (*(local_390->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(local_390,local_268,uVar15)
  ;
  pPVar14 = local_3b8;
  if (bVar8) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  if (pVar10 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_2a8.size) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (bVar16) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  this_01 = local_390;
  if (pVar9 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if (local_288.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_288.size) {
    operator_delete(local_288.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_3b0.size) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_3b0,(this_01->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_288,(this_01->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2a8,(this_01->super_Mesh).super_PointCloud.vertex,3,2);
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  psVar4 = &local_2e8.size;
  local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"x","");
  PLYReader::setReceiver
            (pPVar14,(string *)&local_388,(string *)&local_2e8,&local_3b0.super_PLYReceiver);
  if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"y","");
  PLYReader::setReceiver
            (pPVar14,(string *)&local_388,(string *)&local_2e8,&local_288.super_PLYReceiver);
  if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"z","");
  PLYReader::setReceiver
            (pPVar14,(string *)&local_388,(string *)&local_2e8,&local_2a8.super_PLYReceiver);
  if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_388,(this_01->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2e8,(this_01->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_50,(this_01->super_Mesh).super_PointCloud.scanprop,3,2);
  if ((this_01->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    psVar3 = &local_308.size;
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    psVar4 = &local_328.size;
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"scan_size","");
    PLYReader::setReceiver
              (pPVar14,(string *)&local_308,(string *)&local_328,&local_388.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"scan_error","");
    PLYReader::setReceiver
              (pPVar14,(string *)&local_308,(string *)&local_328,&local_2e8.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"scan_conf","");
    PLYReader::setReceiver
              (pPVar14,(string *)&local_308,(string *)&local_328,&local_50.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_308,(this_01->super_Mesh).super_PointCloud.scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_328,(this_01->super_Mesh).super_PointCloud.scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_70,(this_01->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((this_01->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    psVar3 = &local_348.size;
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
    psVar4 = &local_368.size;
    local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"sx","");
    PLYReader::setReceiver
              (pPVar14,(string *)&local_348,(string *)&local_368,&local_308.super_PLYReceiver);
    if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
    local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"sy","");
    PLYReader::setReceiver
              (pPVar14,(string *)&local_348,(string *)&local_368,&local_328.super_PLYReceiver);
    if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
    local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"sz","");
    PLYReader::setReceiver
              (pPVar14,(string *)&local_348,(string *)&local_368,&local_70.super_PLYReceiver);
    if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_348,(this_01->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_368,(this_01->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_90,(this_01->super_Mesh).normal,3,2);
  paVar1 = &local_3f8.field_2;
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  paVar2 = &local_3d8.field_2;
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nx","");
  PLYReader::setReceiver(pPVar14,&local_3f8,&local_3d8,&local_348.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"ny","");
  PLYReader::setReceiver(pPVar14,&local_3f8,&local_3d8,&local_368.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nz","");
  PLYReader::setReceiver(pPVar14,&local_3f8,&local_3d8,&local_90.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  uVar15 = PLYReader::instancesOfElement(pPVar14,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  (*(this_01->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this_01,uVar15 & 0xffffffff)
  ;
  local_260._vptr_PLYReceiver = (_func_int **)&PTR_setValue_001309a0;
  local_258 = this_01;
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"vertex_index","");
  PLYReader::setReceiver(pPVar14,&local_3f8,&local_3d8,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"vertex_indices","");
  PLYReader::setReceiver(pPVar14,&local_3f8,&local_3d8,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_200._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00130b58;
  local_1f8 = this_01;
  local_210._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00130b88;
  local_208 = this_01;
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"texcoord","");
  PLYReader::setReceiver(pPVar14,&local_3f8,&local_3d8,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"texnumber","");
  PLYReader::setReceiver(pPVar14,&local_3f8,&local_3d8,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  PLYReader::readData(pPVar14);
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nx","");
  pVar9 = PLYReader::getTypeOfProperty(pPVar14,&local_3f8,&local_3d8);
  if (pVar9 == ply_none) {
    bVar16 = true;
  }
  else {
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vertex","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"ny","");
    pVar9 = PLYReader::getTypeOfProperty(pPVar14,&local_230,&local_170);
    if (pVar9 == ply_none) {
      bVar16 = true;
    }
    else {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"vertex","");
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"nz","");
      pVar9 = PLYReader::getTypeOfProperty(pPVar14,&local_190,&local_1b0);
      bVar16 = pVar9 == ply_none;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      this_01 = local_390;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
        this_01 = local_390;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (bVar16) {
    Mesh::recalculateNormals(&this_01->super_Mesh);
  }
  else {
    Mesh::normalizeNormals(&this_01->super_Mesh);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  return;
}

Assistant:

void MultiTexturedMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  basepath=ply.getName();

  size_t j=basepath.find_last_of("/\\");

  if (j != basepath.npos)
  {
    basepath=basepath.substr(0, j+1);
  }
  else
  {
    basepath="";
  }

  // get names of textures

  std::vector<std::string> comment;
  ply.getComments(comment);

  resizeTextureList(0);

  for (size_t i=0; i<comment.size(); i++)
  {
    size_t k=comment[i].find("TextureFile");

    if (k != 0)
    {
      k=comment[i].find("texturefile");
    }

    if (k == 0)
    {
      std::string s=comment[i].substr(11);
      gutil::trim(s);

      resizeTextureList(getTextureCount()+1);
      setTextureName(getTextureCount()-1, s);
    }
  }

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  MultiTextureCoordReceiver tc(*this);
  MultiTextureIndexReceiver ti(*this);

  ply.setReceiver("face", "texcoord", &tc);
  ply.setReceiver("face", "texnumber", &ti);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}